

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O2

void __thiscall CEPlanet::init_members(CEPlanet *this)

{
  allocator<double> local_39;
  value_type_conflict1 local_38;
  vector<double,_std::allocator<double>_> local_30;
  
  this->albedo_ = 0.0;
  this->reference_ = (CEPlanet *)0x0;
  this->algorithm_type_ = SOFA;
  this->radius_m_ = 0.0;
  this->mass_kg_ = 0.0;
  *(undefined4 *)&this->sofa_planet_id_ = 0;
  *(undefined4 *)((long)&this->sofa_planet_id_ + 4) = 0;
  *(undefined4 *)&this->cached_jd_ = 0x39a08cea;
  *(undefined4 *)((long)&this->cached_jd_ + 4) = 0xc6293e59;
  local_38 = 0.0;
  std::allocator<double>::allocator(&local_39);
  std::vector<double,_std::allocator<double>_>::vector(&local_30,3,&local_38,&local_39);
  std::vector<double,_std::allocator<double>_>::operator=(&this->pos_icrs_,&local_30);
  std::vector<double,_std::allocator<double>_>::~vector(&local_30);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_39);
  local_38 = 0.0;
  std::allocator<double>::allocator(&local_39);
  std::vector<double,_std::allocator<double>_>::vector(&local_30,3,&local_38,&local_39);
  std::vector<double,_std::allocator<double>_>::operator=(&this->vel_icrs_,&local_30);
  std::vector<double,_std::allocator<double>_>::~vector(&local_30);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_39);
  this->perihelion_long_deg_per_cent_ = 0.0;
  this->ascending_node_lon_deg_per_cent_ = 0.0;
  this->inclination_deg_per_cent_ = 0.0;
  this->mean_longitude_deg_per_cent_ = 0.0;
  this->semi_major_axis_au_per_cent_ = 0.0;
  this->eccentricity_per_cent_ = 0.0;
  this->perihelion_lon_deg_ = 0.0;
  this->ascending_node_lon_deg_ = 0.0;
  this->inclination_deg_ = 0.0;
  this->mean_longitude_deg_ = 0.0;
  this->semi_major_axis_au_ = 0.0;
  this->eccentricity_ = 0.0;
  this->E_tol = 1e-06;
  this->b_ = 0.0;
  this->c_ = 0.0;
  this->s_ = 0.0;
  this->f_ = 0.0;
  return;
}

Assistant:

void CEPlanet::init_members(void)
{
    // Basic properties
    radius_m_ = 0.0;
    mass_kg_  = 0.0;
    albedo_   = 0.0;
    
    // The following is a reference point for the observer
    // This will almost always be the Earth-Moon barycenter
    reference_ = nullptr;//new CEPlanet(CEPlanet::EMBarycenter());
    
    // Define the algorithm used to compute the planets position
    algorithm_type_ = CEPlanetAlgo::SOFA;
    // Sofa planet id (note: 3.5 implies the earth-center which uses a different method
    // than the other planets)
    sofa_planet_id_ = 0;
    
    // The coordinates representing the current position will need to be
    // relative to some date, since planets move. This is the cached date
    cached_jd_ = -1.0e30;
    pos_icrs_ = std::vector<double>(3, 0.0);
    // Note, these velocities are only computed for "algorithm_type_=SOFA" at the moment
    vel_icrs_ = std::vector<double>(3, 0.0);
    
    /******************************************
     * Properties for the JPL algorithm
     ******************************************/
    // Orbital properties (element 2 is the derivative)
    semi_major_axis_au_     = 0.0;
    eccentricity_           = 0.0;
    inclination_deg_        = 0.0;
    mean_longitude_deg_     = 0.0;
    perihelion_lon_deg_     = 0.0;
    ascending_node_lon_deg_ = 0.0;
    
    // Derivatives of orbital properties
    semi_major_axis_au_per_cent_     = 0.0;
    eccentricity_per_cent_           = 0.0;
    inclination_deg_per_cent_        = 0.0;
    mean_longitude_deg_per_cent_     = 0.0;
    perihelion_long_deg_per_cent_    = 0.0;
    ascending_node_lon_deg_per_cent_ = 0.0;
    
    // The following is the tolerance for the computation of eccentric anomoly
    E_tol = 1.0e-6;
    
    // Extra terms for outer planets (Jupiter, Saturn, Uranus, Neptune, and Pluto)
    b_ = 0.0;
    c_ = 0.0;
    s_ = 0.0;
    f_ = 0.0;
}